

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isPossibleExpression(TokenKind kind)

{
  bool bVar1;
  SyntaxKind SVar2;
  uint uVar3;
  undefined6 in_register_0000003a;
  bool bVar4;
  
  bVar4 = true;
  uVar3 = (uint)CONCAT62(in_register_0000003a,kind);
  if ((int)uVar3 < 0xc3) {
    if ((uVar3 < 0x30) && ((0xf0000082b3fcU >> ((ulong)kind & 0x3f) & 1) != 0)) {
      return true;
    }
    if ((uVar3 - 0x57 < 0x34) && ((0x8000000000011U >> ((ulong)(uVar3 - 0x57) & 0x3f) & 1) != 0)) {
      return true;
    }
  }
  else {
    if ((uVar3 - 0x122 < 0x35) && ((0x18000000400141U >> ((ulong)(uVar3 - 0x122) & 0x3f) & 1) != 0))
    {
      return true;
    }
    if ((uVar3 - 0xd1 < 0x34) && ((0x8000000100021U >> ((ulong)(uVar3 - 0xd1) & 0x3f) & 1) != 0)) {
      return true;
    }
    if (uVar3 == 0xc3) {
      return true;
    }
  }
  bVar1 = isPossibleDataType(kind);
  if ((!bVar1) && (SVar2 = getUnaryPrefixExpression(kind), SVar2 == Unknown)) {
    SVar2 = getBinaryExpression(kind);
    bVar4 = SVar2 != Unknown;
  }
  return bVar4;
}

Assistant:

bool SyntaxFacts::isPossibleExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::TaggedKeyword:
        case TokenKind::StringLiteral:
        case TokenKind::IntegerLiteral:
        case TokenKind::UnbasedUnsizedLiteral:
        case TokenKind::IntegerBase:
        case TokenKind::RealLiteral:
        case TokenKind::TimeLiteral:
        case TokenKind::NullKeyword:
        case TokenKind::Dollar:
        case TokenKind::LocalKeyword:
        case TokenKind::OpenParenthesis:
        case TokenKind::OpenBrace:
        case TokenKind::OpenBracket:
        case TokenKind::UnitSystemName:
        case TokenKind::ThisKeyword:
        case TokenKind::SuperKeyword:
        case TokenKind::Identifier:
        case TokenKind::SystemIdentifier:
        case TokenKind::RootSystemName:
        case TokenKind::Hash:
        case TokenKind::DoubleHash:
        case TokenKind::At:
        case TokenKind::RepeatKeyword:
        case TokenKind::TypeKeyword:
        case TokenKind::ApostropheOpenBrace:
            // expressions can't actually start with these, but we'll allow it
            // to provide good error handling
        case TokenKind::DoubleColon:
        case TokenKind::Question:
        case TokenKind::MatchesKeyword:
        case TokenKind::TripleAnd:
        case TokenKind::InsideKeyword:
        case TokenKind::DistKeyword:
            return true;
        default:
            break;
    }

    if (isPossibleDataType(kind))
        return true;

    SyntaxKind opKind = getUnaryPrefixExpression(kind);
    if (opKind != SyntaxKind::Unknown)
        return true;

    opKind = getBinaryExpression(kind);
    if (opKind != SyntaxKind::Unknown)
        return true;

    return false;
}